

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmap.h
# Opt level: O2

QEventPoint * __thiscall QMap<int,_QEventPoint>::operator[](QMap<int,_QEventPoint> *this,int *key)

{
  QMapData<std::map<int,_QEventPoint,_std::less<int>,_std::allocator<std::pair<const_int,_QEventPoint>_>_>_>
  *pQVar1;
  iterator iVar2;
  long in_FS_OFFSET;
  pair<std::_Rb_tree_iterator<std::pair<const_int,_QEventPoint>_>,_bool> pVar3;
  QEventPoint local_48;
  pair<const_int,_QEventPoint> local_40;
  QExplicitlySharedDataPointerV2<QMapData<std::map<int,_QEventPoint,_std::less<int>,_std::allocator<std::pair<const_int,_QEventPoint>_>_>_>_>
  local_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  local_30.d.ptr =
       (totally_ordered_wrapper<QMapData<std::map<int,_QEventPoint,_std::less<int>,_std::allocator<std::pair<const_int,_QEventPoint>_>_>_>_*>
        )(this->d).d.ptr;
  if ((local_30.d.ptr ==
       (QMapData<std::map<int,_QEventPoint,_std::less<int>,_std::allocator<std::pair<const_int,_QEventPoint>_>_>_>
        *)0x0) ||
     ((__atomic_base<int>)
      *(__int_type *)
       &(((QMapData<std::map<int,_QEventPoint,_std::less<int>,_std::allocator<std::pair<const_int,_QEventPoint>_>_>_>
           *)local_30.d.ptr)->super_QSharedData).ref.super_QAtomicInteger<int>.
        super_QBasicAtomicInteger<int>._q_value == (__atomic_base<int>)0x1)) {
    local_30.d.ptr =
         (totally_ordered_wrapper<QMapData<std::map<int,_QEventPoint,_std::less<int>,_std::allocator<std::pair<const_int,_QEventPoint>_>_>_>_*>
          )(QMapData<std::map<int,_QEventPoint,_std::less<int>,_std::allocator<std::pair<const_int,_QEventPoint>_>_>_>
            *)0x0;
  }
  else {
    LOCK();
    (((QMapData<std::map<int,_QEventPoint,_std::less<int>,_std::allocator<std::pair<const_int,_QEventPoint>_>_>_>
       *)local_30.d.ptr)->super_QSharedData).ref.super_QAtomicInteger<int>.
    super_QBasicAtomicInteger<int>._q_value =
         (Type)((int)(((QMapData<std::map<int,_QEventPoint,_std::less<int>,_std::allocator<std::pair<const_int,_QEventPoint>_>_>_>
                        *)local_30.d.ptr)->super_QSharedData).ref.super_QAtomicInteger<int>.
                     super_QBasicAtomicInteger<int>._q_value + 1);
    UNLOCK();
  }
  detach(this);
  iVar2 = std::
          _Rb_tree<int,_std::pair<const_int,_QEventPoint>,_std::_Select1st<std::pair<const_int,_QEventPoint>_>,_std::less<int>,_std::allocator<std::pair<const_int,_QEventPoint>_>_>
          ::find(&(((this->d).d.ptr)->m)._M_t,key);
  pQVar1 = (this->d).d.ptr;
  if ((_Rb_tree_header *)iVar2._M_node == &(pQVar1->m)._M_t._M_impl.super__Rb_tree_header) {
    QEventPoint::QEventPoint(&local_48,-1,(QPointingDevice *)0x0);
    local_40.second.d.d.ptr = local_48.d.d.ptr;
    local_40.first = *key;
    local_48.d.d.ptr =
         (QExplicitlySharedDataPointer<QEventPointPrivate>)
         (totally_ordered_wrapper<QEventPointPrivate_*>)0x0;
    pVar3 = std::
            _Rb_tree<int,std::pair<int_const,QEventPoint>,std::_Select1st<std::pair<int_const,QEventPoint>>,std::less<int>,std::allocator<std::pair<int_const,QEventPoint>>>
            ::_M_insert_unique<std::pair<int_const,QEventPoint>>
                      ((_Rb_tree<int,std::pair<int_const,QEventPoint>,std::_Select1st<std::pair<int_const,QEventPoint>>,std::less<int>,std::allocator<std::pair<int_const,QEventPoint>>>
                        *)&pQVar1->m,&local_40);
    iVar2._M_node = (_Base_ptr)pVar3.first._M_node;
    QEventPoint::~QEventPoint(&local_40.second);
    QEventPoint::~QEventPoint(&local_48);
  }
  QtPrivate::
  QExplicitlySharedDataPointerV2<QMapData<std::map<int,_QEventPoint,_std::less<int>,_std::allocator<std::pair<const_int,_QEventPoint>_>_>_>_>
  ::~QExplicitlySharedDataPointerV2(&local_30);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return (QEventPoint *)&iVar2._M_node[1]._M_parent;
  }
  __stack_chk_fail();
}

Assistant:

T &operator[](const Key &key)
    {
        const auto copy = d.isShared() ? *this : QMap(); // keep `key` alive across the detach
        detach();
        auto i = d->m.find(key);
        if (i == d->m.end())
            i = d->m.insert({key, T()}).first;
        return i->second;
    }